

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O1

void __thiscall PDA::Exception::Exception::Exception(Exception *this,wstring *what)

{
  pointer pwVar1;
  
  this->_vptr_Exception = (_func_int **)&PTR_what_abi_cxx11__0014e8b8;
  (this->m_information)._M_dataplus._M_p = (pointer)&(this->m_information).field_2;
  pwVar1 = (what->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->m_information,pwVar1,pwVar1 + what->_M_string_length);
  return;
}

Assistant:

Exception::Exception(const std::wstring &what) : m_information(what)
{

}